

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeKeyRoomAction.cpp
# Opt level: O0

void __thiscall
ThreeKeyRoomAction::pickUpItem(ThreeKeyRoomAction *this,itemType *item,string *information)

{
  ItemWrapper *this_00;
  undefined1 local_60 [64];
  string *local_20;
  string *information_local;
  itemType *item_local;
  ThreeKeyRoomAction *this_local;
  
  local_20 = information;
  information_local = (string *)item;
  item_local = (itemType *)this;
  this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,item);
  ItemWrapper::setLocation(this_00,BACKPACK);
  ItemTable::getValue((this->super_AbstractRoomAction).itemList,(itemType *)information_local);
  ItemWrapper::getItemName_abi_cxx11_((ItemWrapper *)local_60);
  std::operator+(local_60 + 0x20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "You pick up the ");
  std::__cxx11::string::operator=((string *)local_20,(string *)(local_60 + 0x20));
  std::__cxx11::string::~string((string *)(local_60 + 0x20));
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void ThreeKeyRoomAction::pickUpItem(const itemType &item, std::string &information) const {
    itemList->getValue(item)->setLocation(BACKPACK);
    information = "You pick up the " + itemList->getValue(item)->getItemName();
}